

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O1

void nn_ws_handshake_server_reply(nn_ws_handshake *self)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *__format;
  char *pcVar3;
  char accept_key [29];
  nn_iovec response;
  char acStack_58 [40];
  nn_iovec local_30;
  
  pcVar3 = acStack_58;
  __s = self->response;
  memset(__s,0,0x200);
  switch(self->response_code) {
  case 0:
    iVar1 = nn_ws_handshake_hash_key(self->key,self->key_len,acStack_58,0x136514);
    if (iVar1 < 0) goto LAB_0012efc2;
    sVar2 = strlen(acStack_58);
    if (sVar2 != 0x1c) goto LAB_0012efc7;
    __dest = (char *)nn_alloc_(self->protocol_len + 1);
    if (__dest != (char *)0x0) {
      strncpy(__dest,self->protocol,self->protocol_len);
      __dest[self->protocol_len] = '\0';
      __format = 
      "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: %s\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
      ;
      goto LAB_0012ef7a;
    }
    goto LAB_0012efcc;
  case 1:
    pcVar3 = "400 Opening Handshake Too Long";
    break;
  default:
    goto switchD_0012ee82_caseD_2;
  case 3:
    pcVar3 = "400 Cannot Have Body";
    break;
  case 4:
    pcVar3 = "400 Unsupported WebSocket Version";
    break;
  case 5:
    pcVar3 = "400 Missing nanomsg Required Headers";
    break;
  case 6:
    pcVar3 = "400 Incompatible Socket Type";
    break;
  case 7:
    pcVar3 = "400 Unrecognized Socket Type";
  }
  __dest = (char *)nn_alloc_(self->version_len + 1);
  if (__dest != (char *)0x0) {
    strncpy(__dest,self->version,self->version_len);
    __dest[self->version_len] = '\0';
    __format = "HTTP/1.1 %s\r\nSec-WebSocket-Version: %s\r\n";
LAB_0012ef7a:
    sprintf(__s,__format,pcVar3,__dest);
    nn_free(__dest);
    local_30.iov_len = strlen(__s);
    local_30.iov_base = __s;
    nn_usock_send(self->usock,&local_30,1);
    return;
  }
  nn_ws_handshake_server_reply_cold_1();
LAB_0012efc2:
  nn_ws_handshake_server_reply_cold_4();
LAB_0012efc7:
  nn_ws_handshake_server_reply_cold_2();
LAB_0012efcc:
  nn_ws_handshake_server_reply_cold_3();
switchD_0012ee82_caseD_2:
  nn_ws_handshake_server_reply_cold_5();
}

Assistant:

static void nn_ws_handshake_server_reply (struct nn_ws_handshake *self)
{
    struct nn_iovec response;
    char *code;
    char *version;
    char *protocol;
    int rc;

    /*  Allow room for NULL terminator. */
    char accept_key [NN_WS_HANDSHAKE_ACCEPT_KEY_LEN + 1];

    memset (self->response, 0, sizeof (self->response));

    if (self->response_code == NN_WS_HANDSHAKE_RESPONSE_OK) {
        /*  Upgrade connection as per RFC 6455 section 4.2.2. */
        
        rc = nn_ws_handshake_hash_key (self->key, self->key_len,
            accept_key, sizeof (accept_key));
        nn_assert (rc >= 0);

        nn_assert (strlen (accept_key) == NN_WS_HANDSHAKE_ACCEPT_KEY_LEN);

        protocol = nn_alloc (self->protocol_len + 1, "WebSocket protocol");
        alloc_assert (protocol);
        strncpy (protocol, self->protocol, self->protocol_len);
        protocol [self->protocol_len] = '\0';

        sprintf (self->response,
            "HTTP/1.1 101 Switching Protocols\r\n"
            "Upgrade: websocket\r\n"
            "Connection: Upgrade\r\n"
            "Sec-WebSocket-Accept: %s\r\n"
            "Sec-WebSocket-Protocol: %s\r\n\r\n",
            accept_key, protocol);

        nn_free (protocol);
    }
    else {
        /*  Fail the connection with a helpful hint. */
        switch (self->response_code) {
        case NN_WS_HANDSHAKE_RESPONSE_TOO_BIG:
            code = "400 Opening Handshake Too Long";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_WSPROTO:
            code = "400 Cannot Have Body";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_WSVERSION:
            code = "400 Unsupported WebSocket Version";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_NNPROTO:
            code = "400 Missing nanomsg Required Headers";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_NOTPEER:
            code = "400 Incompatible Socket Type";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_UNKNOWNTYPE:
            code = "400 Unrecognized Socket Type";
            break;
        default:
            /*  Unexpected failure response. */
            nn_assert (0);
            break;
        }

        version = nn_alloc (self->version_len + 1, "WebSocket version");
        alloc_assert (version);
        strncpy (version, self->version, self->version_len);
        version [self->version_len] = '\0';

        /*  Fail connection as per RFC 6455 4.4. */
        sprintf (self->response,
            "HTTP/1.1 %s\r\n"
            "Sec-WebSocket-Version: %s\r\n",
            code, version);

        nn_free (version);
    }

    response.iov_len = strlen (self->response);
    response.iov_base = &self->response;

    nn_usock_send (self->usock, &response, 1);

    return;
}